

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

uint * GetCodeCmdCallPrologue(CodeGenRegVmContext *ctx,uint microcodePos)

{
  uint uVar1;
  uint num;
  uint uVar2;
  x86Reg reg2;
  uint *puVar3;
  uint *puVar4;
  uint shift;
  
  puVar3 = ctx->exRegVmConstants + microcodePos;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEBP,sQWORD,rR13,0x108);
  shift = 0;
LAB_0027f23a:
  puVar3 = puVar3 + 3;
  do {
    puVar4 = puVar3;
    if (puVar4[-3] == 1) {
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDX,sQWORD,rR13,0x120);
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDX,0,ctx->currInstructionPos + 1);
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_add64,sQWORD,rR13,0x120,4);
      return puVar4 + -2;
    }
    puVar3 = puVar4 + 1;
    switch(puVar4[-3]) {
    case 2:
      goto switchD_0027f25d_caseD_2;
    case 3:
      puVar3 = puVar4 + -1;
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,puVar4[-2] << 3);
      EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,rEAX);
      shift = shift + 8;
      goto LAB_0027f23a;
    case 4:
      puVar3 = puVar4 + -1;
      EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,shift,puVar4[-2]);
      shift = shift + 4;
      goto LAB_0027f23a;
    case 5:
      uVar1 = puVar4[-2];
      if ((int)uVar1 < 0) {
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,uVar1);
        EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,rEAX);
      }
      else {
        EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov64,sQWORD,rEBP,shift,uVar1);
      }
      puVar3 = puVar4 + -1;
      shift = shift + 8;
      goto LAB_0027f23a;
    case 6:
      uVar1 = puVar4[-2];
      num = puVar4[-1];
      uVar2 = *puVar4;
      if (uVar1 == 3) {
        reg2 = rEBX;
LAB_0027f3b0:
        EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,reg2);
      }
      else {
        if (uVar1 == 2) {
          reg2 = rR14;
          goto LAB_0027f3b0;
        }
        if (uVar1 == 1) {
          reg2 = rR15;
          goto LAB_0027f3b0;
        }
        EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rESI,sQWORD,rEBX,uVar1 << 3);
      }
      EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,num);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,shift);
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,uVar2 >> 2);
      EMIT_OP(&ctx->ctx,o_rep_movsd);
      shift = shift + uVar2;
      goto LAB_0027f23a;
    }
  } while( true );
switchD_0027f25d_caseD_2:
  puVar3 = puVar4 + -1;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,puVar4[-2] << 3);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,shift,rEAX);
  shift = shift + 4;
  goto LAB_0027f23a;
}

Assistant:

unsigned* GetCodeCmdCallPrologue(CodeGenRegVmContext &ctx, unsigned microcodePos)
{
	// Push arguments
	unsigned *microcode = ctx.exRegVmConstants + microcodePos;

#if defined(_M_X64)
	x86Reg rTempStack = rRBP;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rTempStack, sQWORD, rR13, nullcOffsetOf(ctx.vmState, dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
		{
			unsigned value = *microcode++;
			if(value < 0x80000000)
			{
				EMIT_OP_RPTR_NUM(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, value);
			}
			else
			{
				EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, value);
				EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rTempStack, tempStackPtrOffset, rRAX);
			}
			tempStackPtrOffset += sizeof(long long);
		}
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			if(reg == rvrrFrame)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR15);
			else if(reg == rvrrConstants)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rR14);
			else if(reg == rvrrRegisters)
				EMIT_OP_REG_REG(ctx.ctx, o_mov64, rRSI, rRBX);
			else
				EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRSI, sQWORD, rREG, reg * 8);

			EMIT_OP_REG_NUM(ctx.ctx, o_add64, rRSI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rRDI, sQWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rRDX, nullcOffsetOf(ctx.vmState->callStackBase, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add64, sQWORD, rR13, nullcOffsetOf(ctx.vmState, callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;
#else
	x86Reg rTempStack = rEDX;

	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rTempStack, sDWORD, uintptr_t(&ctx.vmState->dataStackTop));

	unsigned tempStackPtrOffset = 0;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushQword:
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode * 8);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, *microcode++ * 8 + 4);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, rEAX);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushImm:
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, *microcode++);
			tempStackPtrOffset += sizeof(int);
			break;
		case rvmiPushImmq:
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rEAX, *microcode++);
			EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset, rEAX);
			EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rTempStack, tempStackPtrOffset + 4, 0);
			tempStackPtrOffset += sizeof(long long);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			EMIT_OP_REG_REG(ctx.ctx, o_mov, rEAX, rESI); // Save frame register
			EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rESI, sDWORD, rREG, reg * 8);
			EMIT_OP_REG_NUM(ctx.ctx, o_add, rESI, offset);
			EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rEDI, sDWORD, rTempStack, tempStackPtrOffset);
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, size >> 2);
			EMIT_OP(ctx.ctx, o_rep_movsd);
			EMIT_OP_REG_REG(ctx.ctx, o_mov, rESI, rEAX); // Restore frame register
			EMIT_REG_READ(ctx.ctx, rESI);

			tempStackPtrOffset += size;
		}
		break;
		}
	}

	// Add call stack frame
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->callStackTop));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, nullcOffsetOf(ctx.vmState->callStackTop, instruction), ctx.currInstructionPos + 1); // vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	EMIT_OP_RPTR_NUM(ctx.ctx, o_add, sDWORD, uintptr_t(&ctx.vmState->callStackTop), sizeof(CodeGenRegVmCallStackEntry)); // vmState->callStackTop++;

	//vmState->regFileLastTop
	EMIT_OP_REG_ADDR(ctx.ctx, o_mov, rECX, sDWORD, uintptr_t(&ctx.vmState->regFileLastTop));

	//vmState->regFileLastTop[rvrrGlobals].ptrValue = uintptr_t(vmState->dataStackBase);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrGlobals * 8, uintptr_t(ctx.vmState->dataStackBase));

	//vmState->regFileLastTop[rvrrFrame].ptrValue = uintptr_t(vmState->dataStackTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrFrame * 8, rTempStack);

	//vmState->regFileLastTop[rvrrConstants].ptrValue = uintptr_t(ctx.exRegVmConstants);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rECX, rvrrConstants * 8, uintptr_t(ctx.exRegVmConstants));

	//vmState->regFileLastTop[rvrrRegisters].ptrValue = uintptr_t(vmState->regFileLastTop);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rECX, rvrrRegisters * 8, rECX);

	//vmState->regFileLastPtr = vmState->regFileLastTop;
	EMIT_OP_ADDR_REG(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->regFileLastPtr), rECX);
#endif

	microcode++;

	return microcode;
}